

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_warc_empty.c
# Opt level: O3

void test_write_format_warc_empty(void)

{
  int iVar1;
  archive *paVar2;
  archive_entry *paVar3;
  size_t used;
  char buff [512];
  size_t local_248;
  archive_entry *local_240;
  undefined1 local_238 [520];
  
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'$',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_warc(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'%',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_warc(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_open_memory(paVar2,local_238,0x200,&local_248);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar2);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'+',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,".");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'1',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'5',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,"..");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L';',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'?',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,"/");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'E',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'I',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,"../");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'O',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'S',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,"../../.");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'Y',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  local_240 = paVar3;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L']',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar3,2,0);
  archive_entry_set_ctime(paVar3,4,0);
  archive_entry_set_mtime(paVar3,5,0);
  archive_entry_copy_pathname(paVar3,"..//.././");
  archive_entry_set_mode(paVar3,0x41ed);
  iVar1 = archive_write_header(paVar2,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'c',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",paVar2)
  ;
  archive_entry_free(paVar3);
  iVar1 = archive_write_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar2);
  iVar1 = archive_write_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar2 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                   ,L'k',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2);
  iVar1 = archive_read_support_filter_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2);
  iVar1 = archive_read_open_memory(paVar2,local_238,local_248);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      paVar2);
  iVar1 = archive_read_next_header(paVar2,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'q',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar2);
  iVar1 = archive_read_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar2);
  iVar1 = archive_read_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc_empty.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_warc_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[512U];
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_warc(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Add "." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add ".." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "/" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "/");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../../." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../../.");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "..//.././" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..//.././");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Test whether last archive is empty indeed. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}